

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O0

float vstr_to_float(char *vstr)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *in_RDI;
  double scale;
  uint expon;
  bool fact;
  uint v2;
  uint pow10;
  uint v1;
  bool sign;
  char *p;
  double v;
  float local_44;
  double local_40;
  double local_38;
  uint local_30;
  uint local_28;
  uint local_24;
  uint local_20;
  char *local_18;
  double local_10;
  
  cVar1 = *in_RDI;
  if ((*in_RDI == '+') || (local_18 = in_RDI, *in_RDI == '-')) {
    local_18 = in_RDI + 1;
  }
  local_20 = 0;
  while (iVar3 = isdigit((int)*local_18), iVar3 != 0) {
    local_20 = local_20 * 10 + *local_18 + -0x30;
    local_18 = local_18 + 1;
  }
  local_10 = (double)local_20;
  if (*local_18 == '.') {
    local_24 = 1;
    local_28 = 0;
    while( true ) {
      local_18 = local_18 + 1;
      iVar3 = isdigit((int)*local_18);
      if (iVar3 == 0) break;
      local_28 = local_28 * 10 + *local_18 + -0x30;
      local_24 = local_24 * 10;
    }
    local_10 = (double)local_28 / (double)local_24 + local_10;
  }
  if ((*local_18 == 'e') || (*local_18 == 'E')) {
    pcVar4 = local_18 + 1;
    cVar2 = *pcVar4;
    if ((*pcVar4 == '+') || (*pcVar4 == '-')) {
      pcVar4 = local_18 + 2;
    }
    local_18 = pcVar4;
    local_30 = 0;
    while (iVar3 = isdigit((int)*local_18), iVar3 != 0) {
      local_30 = local_30 * 10 + *local_18 + -0x30;
      local_18 = local_18 + 1;
    }
    local_38 = 1.0;
    for (; 7 < local_30; local_30 = local_30 - 8) {
      local_38 = local_38 * 100000000.0;
    }
    for (; local_30 != 0; local_30 = local_30 - 1) {
      local_38 = local_38 * 10.0;
    }
    if (cVar2 == '-') {
      local_40 = local_10 / local_38;
    }
    else {
      local_40 = local_10 * local_38;
    }
    local_10 = local_40;
  }
  if (cVar1 == '-') {
    local_10 = -local_10;
  }
  local_44 = (float)local_10;
  return local_44;
}

Assistant:

static float vstr_to_float(const char vstr[16])
{
    double v = 0.0;

    const char* p = vstr;

    // sign
    bool sign = *p != '-';
    if (*p == '+' || *p == '-')
    {
        p++;
    }

    // digits before decimal point or exponent
    unsigned int v1 = 0;
    while (isdigit(*p))
    {
        v1 = v1 * 10 + (*p - '0');
        p++;
    }

    v = (double)v1;

    // digits after decimal point
    if (*p == '.')
    {
        p++;

        unsigned int pow10 = 1;
        unsigned int v2 = 0;

        while (isdigit(*p))
        {
            v2 = v2 * 10 + (*p - '0');
            pow10 *= 10;
            p++;
        }

        v += v2 / (double)pow10;
    }

    // exponent
    if (*p == 'e' || *p == 'E')
    {
        p++;

        // sign of exponent
        bool fact = *p != '-';
        if (*p == '+' || *p == '-')
        {
            p++;
        }

        // digits of exponent
        unsigned int expon = 0;
        while (isdigit(*p))
        {
            expon = expon * 10 + (*p - '0');
            p++;
        }

        double scale = 1.0;
        while (expon >= 8)
        {
            scale *= 1e8;
            expon -= 8;
        }
        while (expon > 0)
        {
            scale *= 10.0;
            expon -= 1;
        }

        v = fact ? v * scale : v / scale;
    }

    //     fprintf(stderr, "v = %f\n", v);
    return sign ? (float)v : (float)-v;
}